

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

bool __thiscall
ctemplate::BaseArena::AdjustLastAlloc(BaseArena *this,void *last_alloc,size_t newsize)

{
  char *pcVar1;
  char *pcVar2;
  
  if ((last_alloc != (void *)0x0) && (pcVar1 = this->last_alloc_, pcVar1 == (char *)last_alloc)) {
    pcVar2 = this->freestart_;
    if ((pcVar2 < pcVar1) || (pcVar1 + this->block_size_ < pcVar2)) {
      __assert_fail("freestart_ >= last_alloc_ && freestart_ <= last_alloc_ + block_size_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                    ,0x15e,"bool ctemplate::BaseArena::AdjustLastAlloc(void *, const size_t)");
    }
    if (newsize <= pcVar2 + (this->remaining_ - (long)pcVar1)) {
      this->freestart_ = pcVar1 + newsize;
      this->remaining_ = (size_t)(pcVar2 + (this->remaining_ - (long)(pcVar1 + newsize)));
      return true;
    }
  }
  return false;
}

Assistant:

bool BaseArena::AdjustLastAlloc(void *last_alloc, const size_t newsize) {
  // It's only legal to call this on the last thing you alloced.
  if (last_alloc == NULL || last_alloc != last_alloc_)  return false;
  // last_alloc_ should never point into a "big" block, w/ size >= block_size_
  assert(freestart_ >= last_alloc_ && freestart_ <= last_alloc_ + block_size_);
  assert(remaining_ >= 0);   // should be: it's a size_t!
  if (newsize > (freestart_ - last_alloc_) + remaining_)
    return false;  // not enough room, even after we get back last_alloc_ space
  const char* old_freestart = freestart_;   // where last alloc used to end
  freestart_ = last_alloc_ + newsize;       // where last alloc ends now
  remaining_ -= (freestart_ - old_freestart); // how much new space we've taken
  return true;
}